

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsCoreSetGlobal(HelicsCore core,char *valueName,char *value,HelicsError *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  HelicsError *in_RCX;
  long in_RDX;
  long in_RSI;
  Core *cppcore;
  HelicsError *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  __sv_type local_48;
  undefined8 local_38;
  undefined8 local_30;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         getCore(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RCX,-4,"Global name cannot be null");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (in_RDX == 0) {
        local_48 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      (**(code **)((this->_M_dataplus)._M_p + 0x2d0))
                (this,local_38,local_30,local_48._M_len,local_48._M_str);
    }
  }
  return;
}

Assistant:

void helicsCoreSetGlobal(HelicsCore core, const char* valueName, const char* value, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    if (valueName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidGlobalString);
        return;
    }
    try {
        cppcore->setGlobal(valueName, AS_STRING_VIEW(value));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}